

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::
     VectorArgMinMaxBase<duckdb::GreaterThan,true,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>
     ::
     Combine<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>,duckdb::VectorArgMinMaxBase<duckdb::GreaterThan,true,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *source,
               ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *target,
               AggregateInputData *param_3)

{
  string_t new_value;
  bool bVar1;
  hugeint_t *in_RDX;
  hugeint_t *in_RSI;
  byte *in_RDI;
  hugeint_t new_value_00;
  undefined8 unaff_retaddr;
  
  if (((*in_RDI & 1) != 0) &&
     (((in_RSI->lower & 1) == 0 ||
      (bVar1 = GreaterThan::Operation<duckdb::hugeint_t>(in_RSI,in_RDX), bVar1)))) {
    new_value_00.upper = (int64_t)*(hugeint_t **)(in_RDI + 0x18);
    new_value_00.lower = *(uint64_t *)(in_RDI + 0x20);
    ArgMinMaxStateBase::AssignValue<duckdb::hugeint_t>
              ((ArgMinMaxStateBase *)&in_RSI[1].upper,*(hugeint_t **)(in_RDI + 0x18),new_value_00);
    *(byte *)((long)&in_RSI->lower + 1) = in_RDI[1] & 1;
    if ((in_RSI->lower & 0x100) == 0) {
      new_value.value.pointer.ptr = (char *)unaff_retaddr;
      new_value.value._0_8_ = in_RDI;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>((string_t *)in_RSI,new_value);
    }
    *(undefined1 *)&in_RSI->lower = 1;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			STATE::template AssignValue<typename STATE::BY_TYPE>(target.value, source.value);
			target.arg_null = source.arg_null;
			if (!target.arg_null) {
				STATE::template AssignValue<typename STATE::ARG_TYPE>(target.arg, source.arg);
			}
			target.is_initialized = true;
		}
	}